

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O3

UnicodeSet * __thiscall icu_63::UnicodeSet::add(UnicodeSet *this,UChar32 c)

{
  int iVar1;
  uint uVar2;
  UChar32 *pUVar3;
  UChar32 *pUVar4;
  int *piVar5;
  int c_00;
  UErrorCode status_1;
  UErrorCode status;
  UErrorCode local_30;
  UErrorCode local_2c;
  
  iVar1 = 0x10ffff;
  if ((uint)c < 0x10ffff) {
    iVar1 = c;
  }
  c_00 = 0;
  if (-1 < c) {
    c_00 = iVar1;
  }
  uVar2 = findCodePoint(this,c_00);
  if ((((uVar2 & 1) == 0) &&
      (this->stringSpan == (UnicodeSetStringSpan *)0x0 && this->bmpSet == (BMPSet *)0x0)) &&
     ((this->fFlags & 1) == 0)) {
    pUVar3 = this->list;
    if (c_00 == pUVar3[(int)uVar2] + -1) {
      pUVar3[(int)uVar2] = c_00;
      if (c_00 == 0x10ffff) {
        local_2c = U_ZERO_ERROR;
        ensureCapacity(this,this->len + 1,&local_2c);
        if (U_ZERO_ERROR < local_2c) {
          return this;
        }
        pUVar3 = this->list;
        iVar1 = this->len;
        this->len = iVar1 + 1;
        pUVar3[iVar1] = 0x110000;
      }
      if ((0 < (int)uVar2) && (c_00 == pUVar3[(ulong)uVar2 - 1])) {
        iVar1 = this->len;
        pUVar4 = pUVar3 + iVar1;
        if (pUVar3 + (long)(int)uVar2 + 1 < pUVar4) {
          if (pUVar4 < pUVar3 + (long)(int)uVar2 + 2) {
            pUVar4 = pUVar3 + (long)(int)uVar2 + 2;
          }
          memmove(pUVar3 + (int)uVar2 + -1,pUVar3 + (long)(int)uVar2 + 1,
                  ((long)pUVar4 + (-5 - (long)(pUVar3 + (int)uVar2)) & 0xfffffffffffffffcU) + 4);
          iVar1 = this->len;
        }
        this->len = iVar1 + -2;
      }
    }
    else if (((int)uVar2 < 1) || (c_00 != pUVar3[(ulong)uVar2 - 1])) {
      local_30 = U_ZERO_ERROR;
      ensureCapacity(this,this->len + 2,&local_30);
      if (U_ZERO_ERROR < local_30) {
        return this;
      }
      pUVar3 = this->list;
      if ((int)uVar2 < this->len) {
        piVar5 = pUVar3 + this->len;
        do {
          piVar5[1] = piVar5[-1];
          piVar5 = piVar5 + -1;
        } while (pUVar3 + (int)uVar2 < piVar5);
      }
      pUVar3[(int)uVar2] = c_00;
      pUVar3[(int)(uVar2 | 1)] = c_00 + 1;
      this->len = this->len + 2;
    }
    else {
      pUVar3[(ulong)uVar2 - 1] = c_00 + 1;
    }
    if (this->pat != (char16_t *)0x0) {
      uprv_free_63(this->pat);
      this->pat = (char16_t *)0x0;
      this->patLen = 0;
    }
  }
  return this;
}

Assistant:

UnicodeSet& UnicodeSet::add(UChar32 c) {
    // find smallest i such that c < list[i]
    // if odd, then it is IN the set
    // if even, then it is OUT of the set
    int32_t i = findCodePoint(pinCodePoint(c));

    // already in set?
    if ((i & 1) != 0  || isFrozen() || isBogus()) return *this;

    // HIGH is 0x110000
    // assert(list[len-1] == HIGH);

    // empty = [HIGH]
    // [start_0, limit_0, start_1, limit_1, HIGH]

    // [..., start_k-1, limit_k-1, start_k, limit_k, ..., HIGH]
    //                             ^
    //                             list[i]

    // i == 0 means c is before the first range

#ifdef DEBUG_US_ADD
    printf("Add of ");
    dump(c);
    printf(" found at %d", i);
    printf(": ");
    dump(list, len);
    printf(" => ");
#endif

    if (c == list[i]-1) {
        // c is before start of next range
        list[i] = c;
        // if we touched the HIGH mark, then add a new one
        if (c == (UNICODESET_HIGH - 1)) {
            UErrorCode status = U_ZERO_ERROR;
            ensureCapacity(len+1, status);
            if (U_FAILURE(status)) {
                // ensureCapacity will mark the object as Bogus if OOM failure happens.
                return *this;
            }
            list[len++] = UNICODESET_HIGH;
        }
        if (i > 0 && c == list[i-1]) {
            // collapse adjacent ranges

            // [..., start_k-1, c, c, limit_k, ..., HIGH]
            //                     ^
            //                     list[i]

            //for (int32_t k=i-1; k<len-2; ++k) {
            //    list[k] = list[k+2];
            //}
            UChar32* dst = list + i - 1;
            UChar32* src = dst + 2;
            UChar32* srclimit = list + len;
            while (src < srclimit) *(dst++) = *(src++);

            len -= 2;
        }
    }

    else if (i > 0 && c == list[i-1]) {
        // c is after end of prior range
        list[i-1]++;
        // no need to check for collapse here
    }

    else {
        // At this point we know the new char is not adjacent to
        // any existing ranges, and it is not 10FFFF.


        // [..., start_k-1, limit_k-1, start_k, limit_k, ..., HIGH]
        //                             ^
        //                             list[i]

        // [..., start_k-1, limit_k-1, c, c+1, start_k, limit_k, ..., HIGH]
        //                             ^
        //                             list[i]

        UErrorCode status = U_ZERO_ERROR;
        ensureCapacity(len+2, status);
        if (U_FAILURE(status)) {
            // ensureCapacity will mark the object as Bogus if OOM failure happens.
            return *this;
        }

        //for (int32_t k=len-1; k>=i; --k) {
        //    list[k+2] = list[k];
        //}
        UChar32* src = list + len;
        UChar32* dst = src + 2;
        UChar32* srclimit = list + i;
        while (src > srclimit) *(--dst) = *(--src);

        list[i] = c;
        list[i+1] = c+1;
        len += 2;
    }

#ifdef DEBUG_US_ADD
    dump(list, len);
    printf("\n");

    for (i=1; i<len; ++i) {
        if (list[i] <= list[i-1]) {
            // Corrupt array!
            printf("ERROR: list has been corrupted\n");
            exit(1);
        }
    }
#endif

    releasePattern();
    return *this;
}